

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void abgr_8888_le_to_rgba_5551
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  ushort *puVar1;
  uint uVar2;
  ushort uVar3;
  uint *puVar4;
  ushort *puVar5;
  int iVar6;
  long lVar7;
  
  lVar7 = (long)width;
  puVar4 = (uint *)((long)src + (long)sx * 4 + (long)(sy * src_pitch));
  puVar5 = (ushort *)((long)dst + (long)dx * 2 + (long)(dy * dst_pitch));
  iVar6 = 0;
  if (height < 1) {
    height = 0;
  }
  for (; iVar6 != height; iVar6 = iVar6 + 1) {
    puVar1 = puVar5 + lVar7;
    for (; puVar5 < puVar1; puVar5 = puVar5 + 1) {
      uVar2 = *puVar4;
      uVar3 = (ushort)(uVar2 >> 0x10);
      *puVar5 = (ushort)((uVar2 & 0xf8) << 8) |
                (ushort)(uVar2 >> 5) & 0x7c0 | uVar3 >> 2 & 0x3e | uVar3 >> 0xf;
      puVar4 = puVar4 + 1;
    }
    puVar4 = puVar4 + (src_pitch / 4 - lVar7);
    puVar5 = puVar5 + (dst_pitch / 2 - lVar7);
  }
  return;
}

Assistant:

static void abgr_8888_le_to_rgba_5551(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint32_t *src_ptr = (const uint32_t *)((const char *)src + sy * src_pitch);
   uint16_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 4 - width;
   int dst_gap = dst_pitch / 2 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint16_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_ABGR_8888_LE_TO_RGBA_5551(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}